

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O2

void __thiscall
highwayhash::Portable::HHStatePortable::AppendAndUpdate
          (HHStatePortable *this,char *from,size_t size_mod32,char *buffer,size_t buffer_valid)

{
  size_t i;
  size_t sVar1;
  HHPacket tmp;
  char local_60 [88];
  
  for (sVar1 = 0; buffer_valid != sVar1; sVar1 = sVar1 + 1) {
    local_60[sVar1] = buffer[sVar1];
  }
  for (sVar1 = 0; size_mod32 != sVar1; sVar1 = sVar1 + 1) {
    local_60[sVar1 + buffer_valid] = from[sVar1];
  }
  Update(this,(HHPacket *)local_60);
  return;
}

Assistant:

HH_INLINE void AppendAndUpdate(const char* HH_RESTRICT from,
                                 const size_t size_mod32,
                                 const char* HH_RESTRICT buffer,
                                 const size_t buffer_valid) {
    HHPacket tmp HH_ALIGNAS(32);
    for (size_t i = 0; i < buffer_valid; ++i) {
      tmp[i] = buffer[i];
    }
    for (size_t i = 0; i < size_mod32; ++i) {
      tmp[buffer_valid + i] = from[i];
    }
    Update(tmp);
  }